

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

string * CLI::detail::remove_escaped_characters(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  uint32_t uVar2;
  char *pcVar3;
  long lVar4;
  invalid_argument *piVar5;
  uint32_t uVar6;
  uint uVar7;
  char *pcVar8;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar3 = (str->_M_dataplus)._M_p;
  pcVar8 = pcVar3;
  do {
    if (pcVar3 + str->_M_string_length <= pcVar8) {
      return __return_storage_ptr__;
    }
    if (*pcVar8 == '\\') {
      if ((long)(pcVar3 + str->_M_string_length) - (long)pcVar8 < 2) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::operator+(&local_b0,"invalid escape sequence ",str);
        ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
        __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      pcVar3 = pcVar8 + 1;
      lVar4 = ::std::__cxx11::string::find(-0x68,(ulong)(uint)(int)pcVar8[1]);
      if ((lVar4 == -1) && (cVar1 = *pcVar3, cVar1 != '0')) {
        if (cVar1 == 'U') {
          if ((long)((str->_M_dataplus)._M_p + (str->_M_string_length - (long)pcVar8)) < 10) {
            piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::operator+(&local_b0,"unicode sequence must have 8 hex codes ",str);
            ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
            __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          uVar7 = 0x10000000;
          uVar6 = 0;
          for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
            uVar2 = hexConvert(pcVar8[lVar4 + 2]);
            if (0xf < uVar2) {
              piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+(&local_b0,"unicode sequence must have 8 hex codes ",str);
              ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
              __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            uVar6 = uVar6 + uVar2 * uVar7;
            uVar7 = uVar7 >> 4;
          }
          append_codepoint(__return_storage_ptr__,uVar6);
          pcVar8 = pcVar8 + 9;
        }
        else {
          if (cVar1 != 'u') {
            piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_90,"unrecognized escape sequence \\",&local_b1);
            ::std::operator+(&local_70,&local_90,*pcVar3);
            ::std::operator+(&local_50,&local_70," in ");
            ::std::operator+(&local_b0,&local_50,str);
            ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
            __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          if ((long)((str->_M_dataplus)._M_p + (str->_M_string_length - (long)pcVar8)) < 6) {
            piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::operator+(&local_b0,"unicode sequence must have 4 hex codes ",str);
            ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
            __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          uVar7 = 0x1000;
          uVar6 = 0;
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            uVar2 = hexConvert(pcVar8[lVar4 + 2]);
            if (0xf < uVar2) {
              piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+(&local_b0,"unicode sequence must have 4 hex codes ",str);
              ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
              __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            uVar6 = uVar6 + uVar2 * uVar7;
            uVar7 = uVar7 >> 4;
          }
          append_codepoint(__return_storage_ptr__,uVar6);
          pcVar8 = pcVar8 + 5;
        }
      }
      else {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pcVar8 = pcVar3;
      }
    }
    else {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar8 = pcVar8 + 1;
    pcVar3 = (str->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

CLI11_INLINE std::string remove_escaped_characters(const std::string &str) {

    std::string out;
    out.reserve(str.size());
    for(auto loc = str.begin(); loc < str.end(); ++loc) {
        if(*loc == '\\') {
            if(str.end() - loc < 2) {
                throw std::invalid_argument("invalid escape sequence " + str);
            }
            auto ecloc = escapedCharsCode.find_first_of(*(loc + 1));
            if(ecloc != std::string::npos) {
                out.push_back(escapedChars[ecloc]);
                ++loc;
            } else if(*(loc + 1) == 'u') {
                // must have 4 hex characters
                if(str.end() - loc < 6) {
                    throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16};
                for(int ii = 2; ii < 6; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 5;
            } else if(*(loc + 1) == 'U') {
                // must have 8 hex characters
                if(str.end() - loc < 10) {
                    throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16 * 16 * 16 * 16 * 16};
                for(int ii = 2; ii < 10; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 9;
            } else if(*(loc + 1) == '0') {
                out.push_back('\0');
                ++loc;
            } else {
                throw std::invalid_argument(std::string("unrecognized escape sequence \\") + *(loc + 1) + " in " + str);
            }
        } else {
            out.push_back(*loc);
        }
    }
    return out;
}